

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O0

size_t __thiscall wasm::anon_unknown_0::RecGroupHasher::hash(RecGroupHasher *this,Type type)

{
  bool bVar1;
  Tuple *tuple;
  HeapType type_00;
  size_t sVar2;
  bool local_32;
  bool local_31;
  BasicType local_30;
  bool local_29;
  size_t local_28;
  size_t digest;
  RecGroupHasher_conflict *this_local;
  Type type_local;
  
  digest = (size_t)this;
  this_local = (RecGroupHasher_conflict *)type.id;
  local_29 = wasm::Type::isBasic((Type *)&this_local);
  local_28 = hash<bool>(&local_29);
  bVar1 = wasm::Type::isBasic((Type *)&this_local);
  if (bVar1) {
    local_30 = wasm::Type::getBasic((Type *)&this_local);
    rehash<wasm::Type::BasicType>(&local_28,&local_30);
    type_local.id = local_28;
  }
  else {
    local_31 = wasm::Type::isTuple((Type *)&this_local);
    rehash<bool>(&local_28,&local_31);
    bVar1 = wasm::Type::isTuple((Type *)&this_local);
    if (bVar1) {
      tuple = wasm::Type::getTuple((Type *)&this_local);
      sVar2 = hash(this,tuple);
      hash_combine(&local_28,sVar2);
      type_local.id = local_28;
    }
    else {
      bVar1 = wasm::Type::isRef((Type *)&this_local);
      if (!bVar1) {
        __assert_fail("type.isRef()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp"
                      ,0x11f,"size_t wasm::(anonymous namespace)::RecGroupHasher::hash(Type)");
      }
      local_32 = wasm::Type::isNullable((Type *)&this_local);
      rehash<bool>(&local_28,&local_32);
      type_00 = wasm::Type::getHeapType((Type *)&this_local);
      sVar2 = hash(this,type_00);
      hash_combine(&local_28,sVar2);
      type_local.id = local_28;
    }
  }
  return type_local.id;
}

Assistant:

size_t hash(Type type) {
    size_t digest = wasm::hash(type.isBasic());
    if (type.isBasic()) {
      wasm::rehash(digest, type.getBasic());
      return digest;
    }
    wasm::rehash(digest, type.isTuple());
    if (type.isTuple()) {
      hash_combine(digest, hash(type.getTuple()));
      return digest;
    }
    assert(type.isRef());
    wasm::rehash(digest, type.isNullable());
    hash_combine(digest, hash(type.getHeapType()));
    return digest;
  }